

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl_mus_player.cpp
# Opt level: O3

void __thiscall OPLmusicFile::OPLmusicFile(OPLmusicFile *this,OPLmusicFile *source,char *filename)

{
  OPLio *pOVar1;
  int iVar2;
  BYTE *__dest;
  DiskWriterIO *this_00;
  
  OPLmusicBlock::OPLmusicBlock(&this->super_OPLmusicBlock);
  (this->super_OPLmusicBlock)._vptr_OPLmusicBlock = (_func_int **)&PTR__OPLmusicFile_006efba8;
  iVar2 = source->ScoreLen;
  this->ScoreLen = iVar2;
  __dest = (BYTE *)operator_new__((long)iVar2);
  (this->super_OPLmusicBlock).super_musicBlock.scoredata = __dest;
  memcpy(__dest,(source->super_OPLmusicBlock).super_musicBlock.scoredata,(long)iVar2);
  (this->super_OPLmusicBlock).SamplesPerTick = (source->super_OPLmusicBlock).SamplesPerTick;
  this->RawPlayer = source->RawPlayer;
  (this->super_OPLmusicBlock).super_musicBlock.score =
       (source->super_OPLmusicBlock).super_musicBlock.score;
  (this->super_OPLmusicBlock).NumChips = (source->super_OPLmusicBlock).NumChips;
  this->WhichChip = 0;
  pOVar1 = (this->super_OPLmusicBlock).super_musicBlock.io;
  if (pOVar1 != (OPLio *)0x0) {
    (*pOVar1->_vptr_OPLio[1])();
  }
  this_00 = (DiskWriterIO *)operator_new(0x60);
  DiskWriterIO::DiskWriterIO(this_00,filename);
  (this->super_OPLmusicBlock).super_musicBlock.io = (OPLio *)this_00;
  iVar2 = (*(this_00->super_OPLio)._vptr_OPLio[2])
                    (this_00,(ulong)(uint)(this->super_OPLmusicBlock).NumChips,0,0);
  (this->super_OPLmusicBlock).NumChips = iVar2;
  (*(this->super_OPLmusicBlock)._vptr_OPLmusicBlock[2])(this);
  return;
}

Assistant:

OPLmusicFile::OPLmusicFile(const OPLmusicFile *source, const char *filename)
{
	ScoreLen = source->ScoreLen;
	scoredata = new BYTE[ScoreLen];
	memcpy(scoredata, source->scoredata, ScoreLen);
	SamplesPerTick = source->SamplesPerTick;
	RawPlayer = source->RawPlayer;
	score = source->score;
	NumChips = source->NumChips;
	WhichChip = 0;
	if (io != NULL)
	{
		delete io;
	}
	io = new DiskWriterIO(filename);
	NumChips = io->OPLinit(NumChips);
	Restart();
}